

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.hpp
# Opt level: O2

Inst * __thiscall mir::inst::OpInst::deep_copy(OpInst *this)

{
  OpInst *this_00;
  VarId local_60;
  Value local_50;
  Value local_30;
  
  this_00 = (OpInst *)operator_new(0x60);
  local_60.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001d90d0;
  local_60.id = (this->super_Inst).dest.id;
  Value::Value(&local_30,&this->lhs);
  Value::Value(&local_50,&this->rhs);
  OpInst(this_00,&local_60,&local_30,&local_50,this->op);
  return &this_00->super_Inst;
}

Assistant:

Inst* deep_copy() { return new OpInst(dest, lhs, rhs, op); }